

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.hpp
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
jessilib::
join<std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,jessilib *this,basic_string_view<char,_std::char_traits<char>_> *args,
          basic_string_view<char,_std::char_traits<char>_> *args_1)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
            (__return_storage_ptr__,args->_M_len + *(long *)this);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (__return_storage_ptr__,*(char **)(this + 8),*(size_type *)this);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (__return_storage_ptr__,args->_M_str,args->_M_len);
  return __return_storage_ptr__;
}

Assistant:

OutT join(ArgsT&&... args) {
	OutT result;
	result.reserve(impl_join::join_sizes(args...));
	impl_join::join_append<OutT, ArgsT...>(result, std::forward<ArgsT>(args)...);
	return result;
}